

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::PropagateIntRangeForNot
          (GlobOpt *this,int32 minimum,int32 maximum,int32 *pNewMin,int32 *pNewMax)

{
  int *piVar1;
  int local_2c;
  int32 *piStack_28;
  int32 tmp;
  int32 *pNewMax_local;
  int32 *pNewMin_local;
  int32 maximum_local;
  int32 minimum_local;
  GlobOpt *this_local;
  
  piStack_28 = pNewMax;
  pNewMax_local = pNewMin;
  pNewMin_local._0_4_ = maximum;
  pNewMin_local._4_4_ = minimum;
  _maximum_local = this;
  IntMathCommon<int>::Not(minimum,pNewMin);
  *piStack_28 = *pNewMax_local;
  IntMathCommon<int>::Not((int32)pNewMin_local,&local_2c);
  piVar1 = min<int>(pNewMax_local,&local_2c);
  *pNewMax_local = *piVar1;
  piVar1 = max<int>(piStack_28,&local_2c);
  *piStack_28 = *piVar1;
  return;
}

Assistant:

void
GlobOpt::PropagateIntRangeForNot(int32 minimum, int32 maximum, int32 *pNewMin, int32* pNewMax)
{
    int32 tmp;
    Int32Math::Not(minimum, pNewMin);
    *pNewMax = *pNewMin;
    Int32Math::Not(maximum, &tmp);
    *pNewMin = min(*pNewMin, tmp);
    *pNewMax = max(*pNewMax, tmp);
}